

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O1

bool __thiscall irr::CIrrDeviceSDL::setWindowIcon(CIrrDeviceSDL *this,IImage *img)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  double __x;
  double __x_00;
  
  if (*(long *)&(this->super_CIrrDeviceStub).field_0xf8 != 0) {
    uVar1 = (img->Size).Width;
    uVar2 = (img->Size).Height;
    lVar4 = SDL_CreateRGBSurface(0,uVar1,uVar2,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
    if (lVar4 != 0) {
      SDL_LockSurface(lVar4);
      iVar3 = (*img->_vptr_IImage[4])
                        (img,*(undefined8 *)(lVar4 + 0x20),(ulong)uVar1,(ulong)uVar2,3,
                         (ulong)*(uint *)(lVar4 + 0x18));
      __x_00 = (double)SDL_UnlockSurface(lVar4);
      if ((char)iVar3 == '\0') {
        os::Printer::log((Printer *)"Could not copy icon image. Is the format not ECF_A8R8G8B8?",
                         __x_00);
      }
      else {
        SDL_SetWindowIcon(*(undefined8 *)&(this->super_CIrrDeviceStub).field_0xf8,lVar4);
      }
      SDL_FreeSurface(lVar4);
      return (bool)(char)iVar3;
    }
    os::Printer::log((Printer *)"Failed to create SDL suface",__x);
  }
  return false;
}

Assistant:

bool CIrrDeviceSDL::setWindowIcon(const video::IImage *img)
{
	if (!Window)
		return false;

	u32 height = img->getDimension().Height;
	u32 width = img->getDimension().Width;

	SDL_Surface *surface = SDL_CreateRGBSurface(0, width, height, 32,
			0x00ff0000, 0x0000ff00, 0x000000ff, 0xff000000);

	if (!surface) {
		os::Printer::log("Failed to create SDL suface", ELL_ERROR);
		return false;
	}

	SDL_LockSurface(surface);
	bool succ = img->copyToNoScaling(surface->pixels, width, height, video::ECF_A8R8G8B8, surface->pitch);
	SDL_UnlockSurface(surface);

	if (!succ) {
		os::Printer::log("Could not copy icon image. Is the format not ECF_A8R8G8B8?", ELL_ERROR);
		SDL_FreeSurface(surface);
		return false;
	}

	SDL_SetWindowIcon(Window, surface);

	SDL_FreeSurface(surface);

	return true;
}